

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

void __thiscall
s2coding::EncodeS2PointVector
          (s2coding *this,Span<const_Vector3<double>_> points,CodingHint hint,Encoder *encoder)

{
  Span<const_Vector3<double>_> points_00;
  Span<const_Vector3<double>_> points_01;
  ostream *poVar1;
  undefined7 in_register_00000009;
  S2LogMessage local_58;
  s2coding *local_48;
  pointer local_40;
  s2coding *local_38;
  pointer local_30;
  Encoder *local_28;
  Encoder *encoder_local;
  s2coding *psStack_18;
  CodingHint hint_local;
  Span<const_Vector3<double>_> points_local;
  
  local_28 = (Encoder *)CONCAT71(in_register_00000009,hint);
  local_40 = points.ptr_;
  encoder_local._7_1_ = (byte)points.len_;
  psStack_18 = this;
  points_local.ptr_ = local_40;
  if (encoder_local._7_1_ == 0) {
    points_01.len_ = (size_type)local_28;
    points_01.ptr_ = local_40;
    local_38 = this;
    local_30 = local_40;
    EncodeS2PointVectorFast(this,points_01,local_28);
  }
  else {
    if (encoder_local._7_1_ != 1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,99,kFatal,(ostream *)&std::cerr);
      poVar1 = S2LogMessage::stream(&local_58);
      poVar1 = std::operator<<(poVar1,"Unknown CodingHint: ");
      std::ostream::operator<<(poVar1,(uint)encoder_local._7_1_);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
    }
    points_00.len_ = (size_type)local_40;
    points_00.ptr_ = (pointer)this;
    local_48 = this;
    EncodeS2PointVectorCompact(points_00,local_28);
  }
  return;
}

Assistant:

void EncodeS2PointVector(Span<const S2Point> points, CodingHint hint,
                         Encoder* encoder) {
  switch (hint) {
    case CodingHint::FAST:
      return EncodeS2PointVectorFast(points, encoder);

    case CodingHint::COMPACT:
      return EncodeS2PointVectorCompact(points, encoder);

    default:
      S2_LOG(DFATAL) << "Unknown CodingHint: " << static_cast<int>(hint);
  }
}